

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

OptionAdder * __thiscall
cxxopts::OptionAdder::operator()
          (OptionAdder *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  Options *this_00;
  bool bVar1;
  char *__s;
  invalid_option_format_error *this_01;
  string local_100;
  shared_ptr<const_cxxopts::Value> local_e0;
  string local_d0;
  string_type local_b0;
  string_type local_90;
  sub_match<const_char_*> *local_70;
  value_type *l;
  value_type *s;
  undefined1 local_50 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string *arg_help_local;
  shared_ptr<const_cxxopts::Value> *value_local;
  string *desc_local;
  string *opts_local;
  OptionAdder *this_local;
  
  result._M_begin = (char *)arg_help;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_50);
  __s = (char *)std::__cxx11::string::c_str();
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)local_50,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)local_50);
  if (!bVar1) {
    l = std::__cxx11::
        match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
        operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_50,2);
    local_70 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_50,3);
    this_00 = this->m_options;
    std::__cxx11::sub_match<const_char_*>::str(&local_90,l);
    std::__cxx11::sub_match<const_char_*>::str(&local_b0,local_70);
    std::__cxx11::string::string((string *)&local_d0,(string *)desc);
    std::shared_ptr<const_cxxopts::Value>::shared_ptr(&local_e0,value);
    std::__cxx11::string::string((string *)&local_100,(string *)arg_help);
    Options::add_option(this_00,&this->m_group,&local_90,&local_b0,&local_d0,&local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_e0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_50);
    return this;
  }
  this_01 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
  invalid_option_format_error::invalid_option_format_error(this_01,opts);
  __cxa_throw(this_01,&invalid_option_format_error::typeinfo,
              invalid_option_format_error::~invalid_option_format_error);
}

Assistant:

OptionAdder&
OptionAdder::operator()
(
  const std::string& opts,
  const std::string& desc,
  std::shared_ptr<const Value> value,
  std::string arg_help
)
{
  std::match_results<const char*> result;
  std::regex_match(opts.c_str(), result, option_specifier);

  if (result.empty())
  {
    throw invalid_option_format_error(opts);
  }

  const auto& s = result[2];
  const auto& l = result[3];

  m_options.add_option(m_group, s.str(), l.str(), desc, value,
    std::move(arg_help));

  return *this;
}